

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O3

int ply_add_list_property(p_ply ply,char *name,e_ply_type length_type,e_ply_type value_type)

{
  size_t sVar1;
  char *__dest;
  int iVar2;
  
  sVar1 = strlen(name);
  if ((sVar1 < 0x100) && ((int)length_type < 0x10 && (int)value_type < 0x10)) {
    __dest = (char *)ply_grow_array(ply,&ply->element[ply->nelements + -1].property,
                                    &ply->element[ply->nelements + -1].nproperties,0x128);
    if (__dest == (char *)0x0) {
      iVar2 = 0;
    }
    else {
      *__dest = '\0';
      __dest[0x100] = -1;
      __dest[0x101] = -1;
      __dest[0x102] = -1;
      __dest[0x103] = -1;
      __dest[0x104] = -1;
      __dest[0x105] = -1;
      __dest[0x106] = -1;
      __dest[0x107] = -1;
      __dest[0x108] = -1;
      __dest[0x109] = -1;
      __dest[0x10a] = -1;
      __dest[0x10b] = -1;
      __dest[0x120] = '\0';
      __dest[0x121] = '\0';
      __dest[0x122] = '\0';
      __dest[0x123] = '\0';
      __dest[0x124] = '\0';
      __dest[0x125] = '\0';
      __dest[0x126] = '\0';
      __dest[0x127] = '\0';
      __dest[0x110] = '\0';
      __dest[0x111] = '\0';
      __dest[0x112] = '\0';
      __dest[0x113] = '\0';
      __dest[0x114] = '\0';
      __dest[0x115] = '\0';
      __dest[0x116] = '\0';
      __dest[0x117] = '\0';
      __dest[0x118] = '\0';
      __dest[0x119] = '\0';
      __dest[0x11a] = '\0';
      __dest[0x11b] = '\0';
      __dest[0x11c] = '\0';
      __dest[0x11d] = '\0';
      __dest[0x11e] = '\0';
      __dest[0x11f] = '\0';
      strcpy(__dest,name);
      __dest[0x100] = '\x10';
      __dest[0x101] = '\0';
      __dest[0x102] = '\0';
      __dest[0x103] = '\0';
      *(e_ply_type *)(__dest + 0x108) = length_type;
      *(e_ply_type *)(__dest + 0x104) = value_type;
      iVar2 = 1;
    }
  }
  else {
    iVar2 = 0;
    ply_ferror(ply,"Invalid arguments");
  }
  return iVar2;
}

Assistant:

int ply_add_list_property(p_ply ply, const char *name, e_ply_type length_type,
                          e_ply_type value_type) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE);
    if (strlen(name) >= WORDSIZE) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    assert(length_type < PLY_LIST);
    assert(value_type < PLY_LIST);
    if (length_type >= PLY_LIST || value_type >= PLY_LIST) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = &ply->element[ply->nelements - 1];
    property = ply_grow_property(ply, element);
    if (!property) return 0;
    strcpy(property->name, name);
    property->type = PLY_LIST;
    property->length_type = length_type;
    property->value_type = value_type;
    return 1;
}